

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTable.cpp
# Opt level: O2

void __thiscall UnitTest_table2::Run(UnitTest_table2 *this)

{
  bool bVar1;
  Value VVar2;
  allocator local_101;
  string local_100;
  anon_union_8_9_8deb4486_for_Value_0 local_e0;
  ValueT local_d8;
  anon_union_8_9_8deb4486_for_Value_0 local_d0;
  undefined4 local_c8;
  Table t;
  anon_union_8_9_8deb4486_for_Value_0 local_98;
  undefined4 local_90;
  String value_str;
  String key_str;
  
  luna::Table::Table(&t);
  luna::String::String((&key_str.super_GCObject).str_,"key");
  luna::String::String((&value_str.super_GCObject).str_,"value");
  local_d8 = 3;
  local_e0.obj_ = (&value_str.super_GCObject).obj_;
  local_d0.obj_ = (&key_str.super_GCObject).obj_;
  local_c8 = local_d8;
  luna::Table::SetValue(&t,(Value *)&local_d0,(Value *)&local_e0);
  VVar2 = luna::Table::GetValue(&t,(Value *)&local_d0);
  local_e0 = VVar2.field_0;
  local_d8 = VVar2.type_;
  if (local_d8 != ValueT_Obj) {
    std::__cxx11::string::string
              ((string *)&local_100,"\'value.type_ == luna::ValueT_Obj\'",
               (allocator *)&local_98.bvalue_);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
  }
  if (local_e0.obj_ != (&value_str.super_GCObject).obj_) {
    std::__cxx11::string::string
              ((string *)&local_100,"\'value.obj_ == &value_str\'",(allocator *)&local_98.bvalue_);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
  }
  local_90 = 3;
  local_98.obj_ = (&value_str.super_GCObject).obj_;
  VVar2 = luna::Table::GetValue(&t,(Value *)&local_98);
  local_e0 = VVar2.field_0;
  local_d8 = VVar2.type_;
  if (local_d8 != ValueT_Nil) {
    std::__cxx11::string::string
              ((string *)&local_100,"\'value.type_ == luna::ValueT_Nil\'",&local_101);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
  }
  bVar1 = luna::Table::FirstKeyValue(&t,(Value *)&local_d0,(Value *)&local_e0);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_100,"\'t.FirstKeyValue(key, value)\'",&local_101);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
  }
  if (local_d0.obj_ != (&key_str.super_GCObject).obj_) {
    std::__cxx11::string::string((string *)&local_100,"\'key.obj_ == &key_str\'",&local_101);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
  }
  if (local_e0.obj_ != (&value_str.super_GCObject).obj_) {
    std::__cxx11::string::string((string *)&local_100,"\'value.obj_ == &value_str\'",&local_101);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
  }
  bVar1 = luna::Table::NextKeyValue(&t,(Value *)&local_d0,(Value *)&local_d0,(Value *)&local_e0);
  if (bVar1) {
    std::__cxx11::string::string
              ((string *)&local_100,"\'!t.NextKeyValue(key, key, value)\'",&local_101);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
  }
  luna::String::~String(&value_str);
  luna::String::~String(&key_str);
  luna::Table::~Table(&t);
  return;
}

Assistant:

TEST_CASE(table2)
{
    luna::Table t;
    luna::String key_str("key");
    luna::String value_str("value");

    luna::Value key;
    luna::Value value;

    key.type_ = luna::ValueT_Obj;
    key.obj_ = &key_str;
    value.type_ = luna::ValueT_Obj;
    value.obj_ = &value_str;

    t.SetValue(key, value);
    value = t.GetValue(key);

    EXPECT_TRUE(value.type_ == luna::ValueT_Obj);
    EXPECT_TRUE(value.obj_ == &value_str);

    luna::Value key_not_existed;
    key_not_existed.type_ = luna::ValueT_Obj;
    key_not_existed.obj_ = &value_str;

    value = t.GetValue(key_not_existed);
    EXPECT_TRUE(value.type_ == luna::ValueT_Nil);

    EXPECT_TRUE(t.FirstKeyValue(key, value));
    EXPECT_TRUE(key.obj_ == &key_str);
    EXPECT_TRUE(value.obj_ == &value_str);

    EXPECT_TRUE(!t.NextKeyValue(key, key, value));
}